

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,TargetType targetType)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  string targetName;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  pcVar1 = (this->Namespace)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->Namespace)._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_40,target);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Create imported target ",0x19);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  switch(targetType) {
  case EXECUTABLE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_executable(",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0xb;
    pcVar5 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x12;
    pcVar5 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x12;
    pcVar5 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x12;
    pcVar5 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x12;
    pcVar5 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_0027d397_caseD_5;
  case INTERFACE_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x15;
    pcVar5 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_library(",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    lVar4 = 0x13;
    pcVar5 = " UNKNOWN IMPORTED)\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
switchD_0027d397_caseD_5:
  bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PROPERTY ENABLE_EXPORTS 1)\n",0x1c);
  }
  bVar2 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PROPERTY FRAMEWORK 1)\n",0x17);
  }
  bVar2 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PROPERTY MACOSX_BUNDLE 1)\n",0x1b);
  }
  bVar2 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PROPERTY BUNDLE 1)\n",0x14);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }
  os << "\n";
}